

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model-base-ekf-flex-estimator-imu.cpp
# Opt level: O0

timespec stateObservation::flexibilityEstimation::diff(timespec *start,timespec *end)

{
  timespec tVar1;
  timespec *end_local;
  timespec *start_local;
  timespec temp;
  
  if (end->tv_nsec - start->tv_nsec < 0) {
    start_local = (timespec *)((end->tv_sec - start->tv_sec) + -1);
    temp.tv_sec = (end->tv_nsec + 1000000000) - start->tv_nsec;
  }
  else {
    start_local = (timespec *)(end->tv_sec - start->tv_sec);
    temp.tv_sec = end->tv_nsec - start->tv_nsec;
  }
  tVar1.tv_nsec = temp.tv_sec;
  tVar1.tv_sec = (__time_t)start_local;
  return tVar1;
}

Assistant:

timespec diff(const timespec & start, const timespec & end)
    {
            timespec temp;
            if ((end.tv_nsec-start.tv_nsec)<0) {
                    temp.tv_sec = end.tv_sec-start.tv_sec-1;
                    temp.tv_nsec = 1000000000+end.tv_nsec-start.tv_nsec;
            } else {
                    temp.tv_sec = end.tv_sec-start.tv_sec;
                    temp.tv_nsec = end.tv_nsec-start.tv_nsec;
            }
            return temp;
    }